

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O0

basic_ostream<wchar_t,_std::char_traits<wchar_t>_> * __thiscall
pstore::dump::number_base::write_decimal<long_long,std::wostream>
          (number_base *this,longlong value,basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *os)

{
  uint uVar1;
  wostream *this_00;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar2;
  undefined1 local_30 [8];
  ios_flags_saver _;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *os_local;
  longlong value_local;
  number_base *this_local;
  
  _._8_8_ = os;
  ios_flags_saver::ios_flags_saver
            ((ios_flags_saver *)local_30,(ios_base *)(os + *(long *)(*(long *)os + -0x18)));
  uVar1 = this->base_;
  if (uVar1 == 8) {
    if (value != 0) {
      std::operator<<((wostream *)_._8_8_,"0");
    }
    std::wostream::operator<<((void *)_._8_8_,std::oct);
  }
  else if (uVar1 == 10) {
    std::wostream::operator<<((void *)_._8_8_,std::dec);
  }
  else {
    if (uVar1 != 0x10) {
      assert_failed("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/dump/value.hpp"
                    ,0xa3);
    }
    this_00 = std::operator<<((wostream *)_._8_8_,"0x");
    std::wostream::operator<<(this_00,std::hex);
  }
  pbVar2 = (basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)
           std::wostream::operator<<((void *)_._8_8_,value);
  ios_flags_saver::~ios_flags_saver((ios_flags_saver *)local_30);
  return pbVar2;
}

Assistant:

OStream & write_decimal (T value, OStream & os) const {
                ios_flags_saver const _{os};
                switch (base_) {
                case 16: os << "0x" << std::hex; break;
                case 8:
                    if (value != 0) {
                        os << "0";
                    }
                    os << std::oct;
                    break;
                case 10: os << std::dec; break;
                default: PSTORE_ASSERT (0); break;
                }
                return os << value;
            }